

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmLinkItem * __thiscall
cmGeneratorTarget::ResolveLinkItem
          (cmLinkItem *__return_storage_ptr__,cmGeneratorTarget *this,string *name,
          cmListFileBacktrace *bt)

{
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  TargetOrString resolved;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> _Stack_b8;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_98;
  TargetOrString local_88;
  string local_60;
  string local_40;
  
  ResolveTargetReference(&local_88,this,name);
  if (local_88.Target == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::string((string *)&local_40,(string *)&local_88);
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)bt);
    cmLinkItem::cmLinkItem(__return_storage_ptr__,&local_40,(cmListFileBacktrace *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    psVar3 = &local_40;
LAB_0028db3b:
    std::__cxx11::string::~string((string *)psVar3);
  }
  else {
    TVar2 = GetType(local_88.Target);
    if (TVar2 == EXECUTABLE) {
      bVar1 = IsExecutableWithExports(local_88.Target);
      if (!bVar1) {
        psVar3 = GetName_abi_cxx11_(local_88.Target);
        std::__cxx11::string::string((string *)&local_60,(string *)psVar3);
        std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_a8,
                     (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
                     bt);
        cmLinkItem::cmLinkItem(__return_storage_ptr__,&local_60,(cmListFileBacktrace *)&local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
        psVar3 = &local_60;
        goto LAB_0028db3b;
      }
    }
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_b8,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)bt);
    cmLinkItem::cmLinkItem(__return_storage_ptr__,local_88.Target,(cmListFileBacktrace *)&_Stack_b8)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b8._M_refcount);
  }
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

cmLinkItem cmGeneratorTarget::ResolveLinkItem(
  std::string const& name, cmListFileBacktrace const& bt) const
{
  TargetOrString resolved = this->ResolveTargetReference(name);

  if (!resolved.Target) {
    return cmLinkItem(resolved.String, bt);
  }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (resolved.Target->GetType() == cmStateEnums::EXECUTABLE &&
      !resolved.Target->IsExecutableWithExports()) {
    return cmLinkItem(resolved.Target->GetName(), bt);
  }

  return cmLinkItem(resolved.Target, bt);
}